

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUnitTest++.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_374d6::TestCheckArrayCloseWorksWithVectors::RunImpl
          (TestCheckArrayCloseWorksWithVectors *this)

{
  TestResults *results;
  reference pvVar1;
  TestResults **ppTVar2;
  size_type sVar3;
  TestDetails **ppTVar4;
  float fVar5;
  TestDetails local_68;
  float local_44;
  int local_40;
  int i;
  allocator<float> local_29;
  undefined1 local_28 [8];
  vector<float,_std::allocator<float>_> a;
  TestCheckArrayCloseWorksWithVectors *this_local;
  
  a.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::allocator<float>::allocator(&local_29);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_28,4,&local_29);
  std::allocator<float>::~allocator(&local_29);
  for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
    fVar5 = (float)local_40;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_28,(long)local_40);
    *pvVar1 = fVar5;
  }
  ppTVar2 = UnitTest::CurrentTest::Results();
  results = *ppTVar2;
  sVar3 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)local_28);
  local_44 = 0.0001;
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_68,*ppTVar4,0x38);
  UnitTest::
  CheckArrayClose<std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>,float>
            (results,(vector<float,_std::allocator<float>_> *)local_28,
             (vector<float,_std::allocator<float>_> *)local_28,(int)sVar3,&local_44,&local_68);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_28);
  return;
}

Assistant:

TEST (CheckArrayCloseWorksWithVectors)
{
    std::vector< float > a(4);
    for (int i = 0; i < 4; ++i)
        a[i] = (float)i;

    CHECK_ARRAY_CLOSE(a, a, (int)a.size(), 0.0001f);
}